

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SetRepeatedEnumValue
          (Reflection *this,Message *message,FieldDescriptor *field,int index,int value)

{
  ulong uVar1;
  EnumDescriptor *this_00;
  EnumValueDescriptor *pEVar2;
  ulong uVar3;
  UnknownFieldSet *this_01;
  FieldDescriptor *local_38;
  _func_void_FieldDescriptor_ptr *local_30;
  
  if (*(Descriptor **)(field + 0x20) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetRepeatedEnum","Field does not match message type.");
  }
  if ((~(byte)field[1] & 0x60) != 0) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetRepeatedEnum",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_30 = FieldDescriptor::TypeOnceInit;
    local_38 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),&local_30,&local_38);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) != 8) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetRepeatedEnum",CPPTYPE_ENUM);
  }
  if (*(char *)(*(long *)(field + 0x10) + 0x3a) != '\x03') {
    this_00 = FieldDescriptor::enum_type(field);
    pEVar2 = EnumDescriptor::FindValueByNumber(this_00,value);
    if (pEVar2 == (EnumValueDescriptor *)0x0) {
      uVar3 = (ulong)(uint)(this->schema_).metadata_offset_;
      uVar1 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar3);
      if ((uVar1 & 1) == 0) {
        this_01 = internal::InternalMetadata::
                  mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                            ((InternalMetadata *)
                             ((long)&(message->super_MessageLite)._vptr_MessageLite + uVar3));
      }
      else {
        this_01 = (UnknownFieldSet *)((uVar1 & 0xfffffffffffffffc) + 8);
      }
      UnknownFieldSet::AddVarint(this_01,*(int *)(field + 4),(long)value);
      return;
    }
  }
  SetRepeatedEnumValueInternal(this,message,field,index,value);
  return;
}

Assistant:

void Reflection::SetRepeatedEnumValue(Message* message,
                                      const FieldDescriptor* field, int index,
                                      int value) const {
  USAGE_CHECK_ALL(SetRepeatedEnum, REPEATED, ENUM);
  if (!CreateUnknownEnumValues(field)) {
    // Check that the value is valid if we don't support direct storage of
    // unknown enum values.
    const EnumValueDescriptor* value_desc =
        field->enum_type()->FindValueByNumber(value);
    if (value_desc == nullptr) {
      MutableUnknownFields(message)->AddVarint(field->number(), value);
      return;
    }
  }
  SetRepeatedEnumValueInternal(message, field, index, value);
}